

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void NavScrollToBringItemIntoView(ImGuiWindow *window,ImRect *item_rect)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  ImRect window_rect;
  ImRect local_20;
  
  local_20.Min.x = (window->InnerMainRect).Min.x + -1.0;
  local_20.Min.y = (window->InnerMainRect).Min.y + -1.0;
  local_20.Max.x = (window->InnerMainRect).Max.x + 1.0;
  local_20.Max.y = (window->InnerMainRect).Max.y + 1.0;
  bVar2 = ImRect::Contains(&local_20,item_rect);
  pIVar1 = GImGui;
  if (bVar2) {
    return;
  }
  if (window->ScrollbarX == true) {
    fVar3 = (item_rect->Min).x;
    if (local_20.Min.x <= fVar3) {
      fVar3 = (item_rect->Max).x;
      if (fVar3 < local_20.Max.x) goto LAB_001618fa;
      fVar3 = (fVar3 - (window->Pos).x) + (window->Scroll).x + (GImGui->Style).ItemSpacing.x;
      fVar4 = 1.0;
    }
    else {
      fVar3 = ((fVar3 - (window->Pos).x) + (window->Scroll).x) - (GImGui->Style).ItemSpacing.x;
      fVar4 = 0.0;
    }
    (window->ScrollTarget).x = fVar3;
    (window->ScrollTargetCenterRatio).x = fVar4;
  }
LAB_001618fa:
  fVar3 = (item_rect->Min).y;
  if (local_20.Min.y <= fVar3) {
    fVar3 = (item_rect->Max).y;
    if (fVar3 < local_20.Max.y) {
      return;
    }
    fVar3 = (fVar3 - (window->Pos).y) + (window->Scroll).y + (pIVar1->Style).ItemSpacing.y;
    fVar4 = 1.0;
  }
  else {
    fVar3 = ((fVar3 - (window->Pos).y) + (window->Scroll).y) - (pIVar1->Style).ItemSpacing.y;
    fVar4 = 0.0;
  }
  (window->ScrollTarget).y = fVar3;
  (window->ScrollTargetCenterRatio).y = fVar4;
  return;
}

Assistant:

static void NavScrollToBringItemIntoView(ImGuiWindow* window, const ImRect& item_rect)
{
    // Scroll to keep newly navigated item fully into view
    ImRect window_rect(window->InnerMainRect.Min - ImVec2(1, 1), window->InnerMainRect.Max + ImVec2(1, 1));
    //g.OverlayDrawList.AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]
    if (window_rect.Contains(item_rect))
        return;

    ImGuiContext& g = *GImGui;
    if (window->ScrollbarX && item_rect.Min.x < window_rect.Min.x)
    {
        window->ScrollTarget.x = item_rect.Min.x - window->Pos.x + window->Scroll.x - g.Style.ItemSpacing.x;
        window->ScrollTargetCenterRatio.x = 0.0f;
    }
    else if (window->ScrollbarX && item_rect.Max.x >= window_rect.Max.x)
    {
        window->ScrollTarget.x = item_rect.Max.x - window->Pos.x + window->Scroll.x + g.Style.ItemSpacing.x;
        window->ScrollTargetCenterRatio.x = 1.0f;
    }
    if (item_rect.Min.y < window_rect.Min.y)
    {
        window->ScrollTarget.y = item_rect.Min.y - window->Pos.y + window->Scroll.y - g.Style.ItemSpacing.y;
        window->ScrollTargetCenterRatio.y = 0.0f;
    }
    else if (item_rect.Max.y >= window_rect.Max.y)
    {
        window->ScrollTarget.y = item_rect.Max.y - window->Pos.y + window->Scroll.y + g.Style.ItemSpacing.y;
        window->ScrollTargetCenterRatio.y = 1.0f;
    }
}